

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O1

cbtScalar __thiscall
cbtTaskSchedulerDefault::parallelSum
          (cbtTaskSchedulerDefault *this,int iBegin,int iEnd,int grainSize,cbtIParallelSumBody *body
          )

{
  cbtSpinMutex *this_00;
  int iVar1;
  ThreadLocalStorage *pTVar2;
  JobQueue *this_01;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  int jobCount;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined4 uVar10;
  float fVar11;
  CProfileSample __profile_1;
  CProfileSample __profile;
  CProfileSample local_4a;
  CProfileSample local_49;
  cbtIParallelSumBody *local_48;
  ulong local_40;
  cbtSpinMutex *local_38;
  
  uVar8 = (ulong)(uint)grainSize;
  local_48 = body;
  CProfileSample::CProfileSample(&local_49,"parallelSum_ThreadSupport");
  local_40 = uVar8;
  if ((grainSize < iEnd - iBegin) && (0 < this->m_numWorkerThreads)) {
    this_00 = &this->m_antiNestingLock;
    bVar5 = cbtSpinMutex::tryLock(this_00);
    if (bVar5) {
      jobCount = ((int)local_40 + -1 + (iEnd - iBegin)) / (int)local_40;
      this->m_numJobs = jobCount;
      local_38 = this_00;
      if (0 < this->m_numActiveJobQueues) {
        lVar9 = 0;
        lVar7 = 0;
        do {
          JobQueue::clearQueue
                    ((JobQueue *)(((this->m_jobQueues).m_data)->m_cachePadding + lVar9 + -0x78),
                     jobCount,0x20);
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0xb8;
        } while (lVar7 < this->m_numActiveJobQueues);
      }
      iVar6 = this->m_numThreads;
      if (0 < (long)iVar6) {
        pTVar2 = (this->m_threadLocalStorage).m_data;
        lVar7 = 0;
        do {
          *(undefined4 *)((long)&pTVar2->m_sumResult + lVar7) = 0;
          lVar7 = lVar7 + 0x38;
        } while ((long)iVar6 * 0x38 - lVar7 != 0);
      }
      prepareWorkerThreads(this);
      if (iBegin < iEnd) {
        iVar6 = 1;
        do {
          this_01 = (this->m_perThreadJobQueues).m_data[iVar6];
          pcVar3 = this_01->m_jobMem;
          iVar1 = this_01->m_allocSize;
          this_01->m_allocSize = iVar1 + 0x20;
          pTVar2 = (this->m_threadLocalStorage).m_data;
          *(undefined ***)(pcVar3 + iVar1) = &PTR_executeJob_00b73ee0;
          *(cbtIParallelSumBody **)(pcVar3 + (long)iVar1 + 8) = local_48;
          *(ThreadLocalStorage **)(pcVar3 + (long)iVar1 + 0x10) = pTVar2;
          *(int *)(pcVar3 + (long)iVar1 + 0x18) = iBegin;
          iBegin = iBegin + (int)local_40;
          iVar4 = iEnd;
          if (iBegin < iEnd) {
            iVar4 = iBegin;
          }
          *(int *)(pcVar3 + (long)iVar1 + 0x1c) = iVar4;
          JobQueue::submitJob(this_01,(IJob *)(pcVar3 + iVar1));
          iVar6 = iVar6 + 1;
          if (this->m_numThreads <= iVar6) {
            iVar6 = 1;
          }
        } while (iBegin < iEnd);
      }
      wakeWorkers(this,jobCount + -1);
      waitJobs(this);
      if ((long)this->m_numThreads < 1) {
        fVar11 = 0.0;
      }
      else {
        fVar11 = 0.0;
        lVar7 = 0;
        do {
          fVar11 = fVar11 + *(float *)((long)&((this->m_threadLocalStorage).m_data)->m_sumResult +
                                      lVar7);
          lVar7 = lVar7 + 0x38;
        } while ((long)this->m_numThreads * 0x38 - lVar7 != 0);
      }
      local_48 = (cbtIParallelSumBody *)CONCAT44(local_48._4_4_,fVar11);
      cbtSpinMutex::unlock(local_38);
      goto LAB_0091e6cc;
    }
  }
  CProfileSample::CProfileSample(&local_4a,"parallelSum_mainThread");
  uVar10 = (**(code **)(*(long *)local_48 + 0x10))(local_48,iBegin,iEnd);
  local_48 = (cbtIParallelSumBody *)CONCAT44(local_48._4_4_,uVar10);
  CProfileSample::~CProfileSample(&local_4a);
LAB_0091e6cc:
  CProfileSample::~CProfileSample(&local_49);
  return local_48._0_4_;
}

Assistant:

virtual cbtScalar parallelSum(int iBegin, int iEnd, int grainSize, const cbtIParallelSumBody& body) BT_OVERRIDE
	{
		BT_PROFILE("parallelSum_ThreadSupport");
		cbtAssert(iEnd >= iBegin);
		cbtAssert(grainSize >= 1);
		int iterationCount = iEnd - iBegin;
		if (iterationCount > grainSize && m_numWorkerThreads > 0 && m_antiNestingLock.tryLock())
		{
			typedef ParallelSumJob JobType;
			int jobCount = (iterationCount + grainSize - 1) / grainSize;
			m_numJobs = jobCount;
			cbtAssert(jobCount >= 2);  // need more than one job for multithreading
			int jobSize = sizeof(JobType);
			for (int i = 0; i < m_numActiveJobQueues; ++i)
			{
				m_jobQueues[i].clearQueue(jobCount, jobSize);
			}

			// initialize summation
			for (int iThread = 0; iThread < m_numThreads; ++iThread)
			{
				m_threadLocalStorage[iThread].m_sumResult = cbtScalar(0);
			}

			// prepare worker threads for incoming work
			prepareWorkerThreads();
			// submit all of the jobs
			int iJob = 0;
			int iThread = kFirstWorkerThreadId;  // first worker thread
			for (int i = iBegin; i < iEnd; i += grainSize)
			{
				cbtAssert(iJob < jobCount);
				int iE = cbtMin(i + grainSize, iEnd);
				JobQueue* jq = m_perThreadJobQueues[iThread];
				cbtAssert(jq);
				cbtAssert((jq - &m_jobQueues[0]) < m_numActiveJobQueues);
				void* jobMem = jq->allocJobMem(jobSize);
				JobType* job = new (jobMem) ParallelSumJob(i, iE, body, &m_threadLocalStorage[0]);  // placement new
				jq->submitJob(job);
				iJob++;
				iThread++;
				if (iThread >= m_numThreads)
				{
					iThread = kFirstWorkerThreadId;  // first worker thread
				}
			}
			wakeWorkers(jobCount - 1);

			// put the main thread to work on emptying the job queue and then wait for all workers to finish
			waitJobs();

			// add up all the thread sums
			cbtScalar sum = cbtScalar(0);
			for (int iThread = 0; iThread < m_numThreads; ++iThread)
			{
				sum += m_threadLocalStorage[iThread].m_sumResult;
			}
			m_antiNestingLock.unlock();
			return sum;
		}
		else
		{
			BT_PROFILE("parallelSum_mainThread");
			// just run on main thread
			return body.sumLoop(iBegin, iEnd);
		}
	}